

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 CalcWindowContentSize(ImGuiWindow *window)

{
  float fVar1;
  float local_20;
  float local_1c;
  ImGuiWindow *window_local;
  ImVec2 sz;
  
  if ((((window->Collapsed & 1U) == 0) || ('\0' < window->AutoFitFramesX)) ||
     ('\0' < window->AutoFitFramesY)) {
    if ((((window->Hidden & 1U) == 0) || (window->HiddenFramesCannotSkipItems != 0)) ||
       (window->HiddenFramesCanSkipItems < 1)) {
      ImVec2::ImVec2((ImVec2 *)&window_local);
      fVar1 = (window->ContentSizeExplicit).x;
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        local_1c = (window->ContentSizeExplicit).x;
      }
      else {
        local_1c = (window->DC).CursorMaxPos.x - (window->DC).CursorStartPos.x;
      }
      fVar1 = (window->ContentSizeExplicit).y;
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        local_20 = (window->ContentSizeExplicit).y;
      }
      else {
        local_20 = (window->DC).CursorMaxPos.y - (window->DC).CursorStartPos.y;
      }
      window_local = (ImGuiWindow *)CONCAT44((float)(int)local_20,(float)(int)local_1c);
    }
    else {
      window_local = *(ImGuiWindow **)&window->ContentSize;
    }
  }
  else {
    window_local = *(ImGuiWindow **)&window->ContentSize;
  }
  return (ImVec2)window_local;
}

Assistant:

static ImVec2 CalcWindowContentSize(ImGuiWindow* window)
{
    if (window->Collapsed)
        if (window->AutoFitFramesX <= 0 && window->AutoFitFramesY <= 0)
            return window->ContentSize;
    if (window->Hidden && window->HiddenFramesCannotSkipItems == 0 && window->HiddenFramesCanSkipItems > 0)
        return window->ContentSize;

    ImVec2 sz;
    sz.x = IM_FLOOR((window->ContentSizeExplicit.x != 0.0f) ? window->ContentSizeExplicit.x : window->DC.CursorMaxPos.x - window->DC.CursorStartPos.x);
    sz.y = IM_FLOOR((window->ContentSizeExplicit.y != 0.0f) ? window->ContentSizeExplicit.y : window->DC.CursorMaxPos.y - window->DC.CursorStartPos.y);
    return sz;
}